

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O1

void PostCreateInt(ebml_element *Element,bool_t SetDefault,int ForProfile)

{
  ebml_context *peVar1;
  undefined4 uVar2;
  void *pvVar3;
  
  pvVar3 = Node_InheritedVMT((node *)Element,0x54494245);
  (**(code **)((long)pvVar3 + 0xb8))(Element,SetDefault,ForProfile);
  Element->DefaultSize = 1;
  if ((SetDefault != 0) && (peVar1 = Element->Context, peVar1->HasDefault != 0)) {
    uVar2 = *(undefined4 *)((long)&peVar1->DefaultValue + 4);
    Element[1].Base.Base.FourCC = *(undefined4 *)&peVar1->DefaultValue;
    Element[1].Base.Base.Magic = uVar2;
    Element->bValueIsSet = '\x01';
    Element->bNeedDataSizeUpdate = '\x01';
  }
  return;
}

Assistant:

static void PostCreateInt(ebml_element *Element, bool_t SetDefault, int ForProfile)
{
    INHERITED(Element,ebml_element_vmt,EBML_INTEGER_CLASS)->PostCreate(Element, SetDefault, ForProfile);
    Element->DefaultSize = 1;
    if (SetDefault && Element->Context->HasDefault)
        EBML_IntegerSetValue((ebml_integer*)Element, Element->Context->DefaultValue);
}